

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_gettable(lua_State *L,int idx)

{
  TValue *t_00;
  TValue *t;
  lu_byte tag;
  int idx_local;
  lua_State *L_local;
  
  t_00 = index2value(L,idx);
  if (t_00->tt_ == 'E') {
    t._3_1_ = luaH_get((Table *)(t_00->value_).gc,(TValue *)((L->top).offset + -0x10),
                       (TValue *)((L->top).offset + -0x10));
  }
  else {
    t._3_1_ = 0x30;
  }
  if ((t._3_1_ & 0xf) == 0) {
    t._3_1_ = luaV_finishget(L,t_00,(TValue *)((L->top).offset + -0x10),
                             (StkId)((L->top).offset + -0x10),t._3_1_);
  }
  return t._3_1_ & 0xf;
}

Assistant:

LUA_API int lua_gettable (lua_State *L, int idx) {
  lu_byte tag;
  TValue *t;
  lua_lock(L);
  api_checkpop(L, 1);
  t = index2value(L, idx);
  luaV_fastget(t, s2v(L->top.p - 1), s2v(L->top.p - 1), luaH_get, tag);
  if (tagisempty(tag))
    tag = luaV_finishget(L, t, s2v(L->top.p - 1), L->top.p - 1, tag);
  lua_unlock(L);
  return novariant(tag);
}